

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O3

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::initPrograms
          (GridRenderTestCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ProgramSources *pPVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  ostringstream src;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  uint local_1d8;
  value_type local_1d0;
  SourceCollections *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"vert","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  local_1d8 = 0;
  paVar1 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_1f8,local_1f0 + (long)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1d8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) flat in highp   vec4 v_color;\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out     mediump vec4 fragColor;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    fragColor = v_color;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"frag","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  local_1d8 = 1;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_1f8,local_1f0 + (long)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1d8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n#extension GL_EXT_tessellation_shader : require\nlayout(vertices = 1) out;\n\nvoid main (void)\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0] = float("
             ,0xce);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,");\n    gl_TessLevelInner[1] = float(",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,");\n    gl_TessLevelOuter[0] = float(",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,");\n    gl_TessLevelOuter[1] = float(",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,");\n    gl_TessLevelOuter[2] = float(",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,");\n    gl_TessLevelOuter[3] = float(",0x24);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n}\n",5);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"tesc","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  local_1d8 = 3;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_1f8,local_1f0 + (long)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1d8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(quads) in;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "// note: No need to use precise gl_Position since position does not depend on order\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((this->m_flags & 0x58) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    // Fill the whole viewport\n",0x1f);
    pcVar5 = 
    "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
               ,0x71);
    pcVar5 = 
    "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    // Calculate position in tessellation grid\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(",0x45);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,this->m_tessGenLevel);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")));\n",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"tese","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  local_1d8 = 4;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_1f8,local_1f0 + (long)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1d8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar2 = this->m_numGeometryInvocations;
  iVar3 = this->m_numGeometryPrimitivesPerInvocation;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(triangles, invocations = ",0x20);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(triangle_strip, max_vertices = ",0x26);
  iVar10 = iVar3 * 4;
  if ((this->m_flags & 0x20) == 0) {
    iVar10 = iVar3 + 2;
  }
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n",
             0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) flat out highp   vec4  v_color;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    const float equalThreshold = 0.001;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
             ,0xa4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
             ,0x67);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
             ,0x67);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
             ,0x67);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
             ,0x68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    // Location in tessellation grid\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    // Which triangle of the two that split the grid cell\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    int numVerticesOnBottomEdge = 0;\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    for (int ndx = 0; ndx < 3; ++ndx)\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"            ++numVerticesOnBottomEdge;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  uVar4 = this->m_flags;
  if ((uVar4 & 0x10) == 0) {
    if ((uVar4 & 0x40) == 0) {
      if ((uVar4 & 8) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    // Fill the input area with slices\n",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
                   ,0x58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
                   ,0x56);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    // Each slice is a invocation\n",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    float sliceHeight = (aabb.w - aabb.y) / float(2 * ",
                   0x36);
        poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n",
                   0x43);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    vec4 outputSliceArea;\n",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.x = aabb.x - gapOffset;\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
                   ,0x47);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.z = aabb.z + gapOffset;\n",0x2c);
        lVar9 = 0x55;
        pcVar5 = 
        "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    // Scatter slices\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                   ,0x53);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * ",0x3f);
        iVar2 = iVar2 * 2;
        poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," + inputTriangleNdx);\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2(",
                   0x4e);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," * ",3);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    // Draw slice to the dstSlice slot\n",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    vec4 outputSliceArea;\n",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.x = float(dstSliceNdx.x)   / float(",0x37);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") * 2.0 - 1.0 - gapOffset;\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.y = float(dstSliceNdx.y)   / float(",0x37);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel * iVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") * 2.0 - 1.0 - gapOffset;\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.z = float(dstSliceNdx.x+1) / float(",0x37);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
        pcVar5 = ") * 2.0 - 1.0 + gapOffset;\n";
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") * 2.0 - 1.0 + gapOffset;\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"    outputSliceArea.w = float(dstSliceNdx.y+1) / float(",0x37);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2 * this->m_tessGenLevel);
        lVar9 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,lVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    // Draw slice\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    for (int ndx = 0; ndx < ",0x1c);
      poVar8 = (ostream *)std::ostream::operator<<(local_1a8,(iVar3 + 2) / 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++ndx)\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
                 ,0x56);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float("
                 ,0x52);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3 / 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"));\n",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "    // Draw grid cells, send each primitive to a separate layer\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n",
                 0x4c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    for (int ndx = 0; ndx < ",0x1c);
      poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++ndx)\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        ivec2 dstGridSize = ivec2(",0x22);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," * ",3);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        ivec2 dstGridNdx = ivec2((gridPosition.x * ",0x33);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n",0x42);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        vec4 dstArea;\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
                 ,0x58);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
                 ,0x58);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
                 ,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Layer = ((baseLayer + ndx) * 11) % ",0x2e);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numLayers);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Layer = ((baseLayer + ndx) * 11) % ",0x2e);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numLayers);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Layer = ((baseLayer + ndx) * 11) % ",0x2e);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numLayers);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        v_color = outputColor;\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"        gl_Layer = ((baseLayer + ndx) * 11) % ",0x2e);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numLayers);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EndPrimitive();\n",0x18);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    // Draw grid cells\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    for (int ndx = 0; ndx < ",0x1c);
    poVar8 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; ++ndx)\n",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        ivec2 dstGridSize = ivec2(",0x22);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," * ",3);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", 2 * ",6);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," * ",3);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        ivec2 dstGridNdx = ivec2(",0x21);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," * ndx + gridPosition.x, ",0x19);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_tessGenLevel);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n",0x45)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        vec4 dstArea;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        v_color = outputColor;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        v_color = outputColor;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        v_color = outputColor;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        v_color = outputColor;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EndPrimitive();\n",0x18);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"geom","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_218);
  std::__cxx11::stringbuf::str();
  local_1d8 = 2;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_1f8,local_1f0 + (long)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1d8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GridRenderTestCase::initPrograms (SourceCollections& programCollection) const
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "layout(location = 0) flat in highp   vec4 v_color;\n"
			<< "layout(location = 0) out     mediump vec4 fragColor;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    fragColor = v_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				"#extension GL_EXT_tessellation_shader : require\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelInner[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[2] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[3] = float(" << m_tessGenLevel << ");\n"
				"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(quads) in;\n"
			<< "\n"
			<< "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n"
			<< "\n"
			<< "// note: No need to use precise gl_Position since position does not depend on order\n"
			<< "void main (void)\n"
			<< "{\n";

		if (m_flags & (FLAG_GEOMETRY_SCATTER_INSTANCES | FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS))
			src << "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n";
		else
			src << "    // Fill the whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n";

		src << "    // Calculate position in tessellation grid\n"
			<< "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(" << m_tessGenLevel << ")));\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Geometry shader
	{
		const int numInvocations = m_numGeometryInvocations;
		const int numPrimitives  = m_numGeometryPrimitivesPerInvocation;

		std::ostringstream src;

		src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles, invocations = " << numInvocations << ") in;\n"
			<< "layout(triangle_strip, max_vertices = " << ((m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) ? (4 * numPrimitives) : (numPrimitives + 2)) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n"
			<< "layout(location = 0) flat out highp   vec4  v_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    const float equalThreshold = 0.001;\n"
			<< "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
			<< "\n"
			<< "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
			<< "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
			<< "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
			<< "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
			<< "\n"
			<< "    // Location in tessellation grid\n"
			<< "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
			<< "\n"
			<< "    // Which triangle of the two that split the grid cell\n"
			<< "    int numVerticesOnBottomEdge = 0;\n"
			<< "    for (int ndx = 0; ndx < 3; ++ndx)\n"
			<< "        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n"
			<< "            ++numVerticesOnBottomEdge;\n"
			<< "    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n"
			<< "\n";

		if (m_flags & FLAG_GEOMETRY_SCATTER_PRIMITIVES)
		{
			// scatter primitives
			src << "    // Draw grid cells\n"
				<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", 2 * " << m_tessGenLevel << " * " << numInvocations << ");\n"
				<< "        ivec2 dstGridNdx = ivec2(" << m_tessGenLevel << " * ndx + gridPosition.x, " << m_tessGenLevel << " * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		{
			// Number of subrectangle instances = num layers
			DE_ASSERT(m_numLayers == numInvocations * 2);

			src << "    // Draw grid cells, send each primitive to a separate layer\n"
				<< "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", " << m_tessGenLevel << ");\n"
				<< "        ivec2 dstGridNdx = ivec2((gridPosition.x * " << numPrimitives << " * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else
		{
			if (m_flags & FLAG_GEOMETRY_SCATTER_INSTANCES)
			{
				src << "    // Scatter slices\n"
					<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
					<< "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * " << (numInvocations*2) << " + inputTriangleNdx);\n"
					<< "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2(" << m_tessGenLevel << ", " << m_tessGenLevel << " * " << (numInvocations*2) << ");\n"
					<< "\n"
					<< "    // Draw slice to the dstSlice slot\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = float(dstSliceNdx.x)   / float(" << m_tessGenLevel << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.y = float(dstSliceNdx.y)   / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.z = float(dstSliceNdx.x+1) / float(" << m_tessGenLevel << ") * 2.0 - 1.0 + gapOffset;\n"
					<< "    outputSliceArea.w = float(dstSliceNdx.y+1) / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 + gapOffset;\n";
			}
			else
			{
				src << "    // Fill the input area with slices\n"
					<< "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
					<< "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
					<< "    // Each slice is a invocation\n"
					<< "    float sliceHeight = (aabb.w - aabb.y) / float(2 * " << numInvocations << ");\n"
					<< "    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n"
					<< "\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = aabb.x - gapOffset;\n"
					<< "    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
					<< "    outputSliceArea.z = aabb.z + gapOffset;\n"
					<< "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n";
			}

			src << "\n"
				<< "    // Draw slice\n"
				<< "    for (int ndx = 0; ndx < " << ((numPrimitives+2)/2) << "; ++ndx)\n"
				<< "    {\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
				<< "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float(" << (numPrimitives/2) << "));\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "    }\n";
		}

		src <<	"}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}